

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O0

PivotColumnEntry * duckdb::PivotColumnEntry::Deserialize(Deserializer *deserializer)

{
  Deserializer *in_RSI;
  PivotColumnEntry *in_RDI;
  char *unaff_retaddr;
  undefined6 in_stack_00000008;
  field_id_t in_stack_0000000e;
  Deserializer *in_stack_00000010;
  field_id_t in_stack_0000001e;
  Deserializer *in_stack_00000020;
  PivotColumnEntry *result;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffee;
  field_id_t field_id;
  PivotColumnEntry *ret;
  
  field_id = (field_id_t)in_stack_ffffffffffffffee;
  ret = in_RDI;
  PivotColumnEntry(in_RDI);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::Value,true>>
            (in_stack_00000010,in_stack_0000000e,unaff_retaddr,&ret->values);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_RSI,field_id,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_00000020,in_stack_0000001e,(char *)in_stack_00000010,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_0000000e,in_stack_00000008));
  return in_RDI;
}

Assistant:

PivotColumnEntry PivotColumnEntry::Deserialize(Deserializer &deserializer) {
	PivotColumnEntry result;
	deserializer.ReadPropertyWithDefault<vector<Value>>(100, "values", result.values);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(101, "star_expr", result.expr);
	deserializer.ReadPropertyWithDefault<string>(102, "alias", result.alias);
	return result;
}